

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

IntrusiveList<SynCallArgument> ParseCallArguments(ParseContext *ctx)

{
  Lexeme *begin;
  IntrusiveList<SynCallArgument> IVar1;
  int iVar2;
  int iVar3;
  SynCallArgument *pSVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar5;
  bool bVar6;
  IntrusiveList<SynCallArgument> arguments;
  
  arguments.head = (SynCallArgument *)0x0;
  arguments.tail = (SynCallArgument *)0x0;
  pSVar4 = ParseCallArgument(ctx);
  if (pSVar4 != (SynCallArgument *)0x0) {
    IntrusiveList<SynCallArgument>::push_back(&arguments,pSVar4);
    bVar5 = pSVar4->name != (SynIdentifier *)0x0;
    while (ctx->currentLexeme->type == lex_comma) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      pSVar4 = ParseCallArgument(ctx);
      if (pSVar4 == (SynCallArgument *)0x0) {
        anon_unknown.dwarf_1519a::Report
                  (ctx,ctx->currentLexeme,
                   "ERROR: expression not found after \',\' in function argument list");
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        begin = ctx->currentLexeme;
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        SynError::SynError((SynError *)CONCAT44(extraout_var_00,iVar3),ctx->currentLexeme,
                           ctx->currentLexeme);
        SynCallArgument::SynCallArgument
                  ((SynCallArgument *)CONCAT44(extraout_var,iVar2),begin,begin,(SynIdentifier *)0x0,
                   (SynBase *)CONCAT44(extraout_var_00,iVar3));
        IntrusiveList<SynCallArgument>::push_back
                  (&arguments,(SynCallArgument *)CONCAT44(extraout_var,iVar2));
        break;
      }
      if (bVar5) {
        bVar6 = true;
        if (pSVar4->name == (SynIdentifier *)0x0) {
          anon_unknown.dwarf_1519a::Report
                    (ctx,ctx->currentLexeme,"ERROR: function argument name expected after \',\'");
          break;
        }
      }
      else {
        bVar6 = pSVar4->name != (SynIdentifier *)0x0;
      }
      bVar5 = (bool)(bVar5 | bVar6);
      IntrusiveList<SynCallArgument>::push_back(&arguments,pSVar4);
    }
  }
  IVar1.tail = arguments.tail;
  IVar1.head = arguments.head;
  return IVar1;
}

Assistant:

IntrusiveList<SynCallArgument> ParseCallArguments(ParseContext &ctx)
{
	IntrusiveList<SynCallArgument> arguments;

	if(SynCallArgument *argument = ParseCallArgument(ctx))
	{
		arguments.push_back(argument);

		bool namedCall = argument->name != NULL;

		while(ctx.Consume(lex_comma))
		{
			argument = ParseCallArgument(ctx);

			if(!argument)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after ',' in function argument list");

				arguments.push_back(new (ctx.get<SynCallArgument>()) SynCallArgument(ctx.Current(), ctx.Current(), NULL, new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current())));
				break;
			}

			if(namedCall && !argument->name)
			{
				Report(ctx, ctx.Current(), "ERROR: function argument name expected after ','");

				break;
			}

			namedCall |= argument->name != NULL;

			arguments.push_back(argument);
		}
	}

	return arguments;
}